

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_storeSeq(seqStore_t *seqStorePtr,size_t litLength,void *literals,U32 offsetCode,
                  size_t mlBase)

{
  size_t mlBase_local;
  U32 offsetCode_local;
  void *literals_local;
  size_t litLength_local;
  seqStore_t *seqStorePtr_local;
  
  ZSTD_wildcopy(seqStorePtr->lit,literals,litLength);
  seqStorePtr->lit = seqStorePtr->lit + litLength;
  if (0xffff < litLength) {
    seqStorePtr->longLengthID = 1;
    seqStorePtr->longLengthPos =
         (U32)((long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3);
  }
  seqStorePtr->sequences->litLength = (U16)litLength;
  seqStorePtr->sequences->offset = offsetCode + 1;
  if (0xffff < mlBase) {
    seqStorePtr->longLengthID = 2;
    seqStorePtr->longLengthPos =
         (U32)((long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3);
  }
  seqStorePtr->sequences->matchLength = (U16)mlBase;
  seqStorePtr->sequences = seqStorePtr->sequences + 1;
  return;
}

Assistant:

MEM_STATIC void ZSTD_storeSeq(seqStore_t* seqStorePtr, size_t litLength, const void* literals, U32 offsetCode, size_t mlBase)
{
#if defined(DEBUGLEVEL) && (DEBUGLEVEL >= 6)
    static const BYTE* g_start = NULL;
    if (g_start==NULL) g_start = (const BYTE*)literals;  /* note : index only works for compression within a single segment */
    {   U32 const pos = (U32)((const BYTE*)literals - g_start);
        DEBUGLOG(6, "Cpos%7u :%3u literals, match%4u bytes at offCode%7u",
               pos, (U32)litLength, (U32)mlBase+MINMATCH, (U32)offsetCode);
    }
#endif
    assert((size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq);
    /* copy Literals */
    assert(seqStorePtr->maxNbLit <= 128 KB);
    assert(seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit);
    ZSTD_wildcopy(seqStorePtr->lit, literals, litLength);
    seqStorePtr->lit += litLength;

    /* literal Length */
    if (litLength>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 1;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].litLength = (U16)litLength;

    /* match offset */
    seqStorePtr->sequences[0].offset = offsetCode + 1;

    /* match Length */
    if (mlBase>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 2;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].matchLength = (U16)mlBase;

    seqStorePtr->sequences++;
}